

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

real __thiscall
fasttext::ProductQuantizer::assign_centroid
          (ProductQuantizer *this,real *x,real *c0,uint8_t *code,int32_t d)

{
  real *y;
  int iVar1;
  real rVar2;
  float local_3c;
  
  local_3c = distL2(x,c0,d);
  *code = '\0';
  y = c0 + d;
  for (iVar1 = 1; iVar1 < this->ksub_; iVar1 = iVar1 + 1) {
    rVar2 = distL2(x,y,d);
    if (rVar2 < local_3c) {
      *code = (uint8_t)iVar1;
      local_3c = rVar2;
    }
    y = y + d;
  }
  return local_3c;
}

Assistant:

real ProductQuantizer::assign_centroid(const real * x, const real* c0,
                                       uint8_t* code, int32_t d) const {
  const real* c = c0;
  real dis = distL2(x, c, d);
  code[0] = 0;
  for (auto j = 1; j < ksub_; j++) {
    c += d;
    real disij = distL2(x, c, d);
    if (disij < dis) {
      code[0] = (uint8_t) j;
      dis = disij;
    }
  }
  return dis;
}